

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqPubSub.cpp
# Opt level: O0

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqPubSub::Receive(ZmqPubSub *this)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  char *__src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar6;
  int ret;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *buff;
  nullptr_t in_stack_ffffffffffffffb8;
  element_type *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = *(undefined8 *)(in_RSI + 8);
  this_00 = in_RDI;
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0xdbce87);
  sVar4 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x10));
  iVar2 = zmq_recv(uVar1,pcVar3,sVar4,1);
  if (iVar2 < 1) {
    std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr
              ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)this_00,
               in_stack_ffffffffffffffb8);
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    std::make_shared<std::vector<char,std::allocator<char>>,int&>
              ((int *)(CONCAT44(iVar2,in_stack_ffffffffffffffe8) & 0xffffffff00ffffff));
    std::
    __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0xdbceda);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0xdbcee2);
    __src = std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0xdbcef4);
    memcpy(pcVar3,__src,(long)iVar2);
    _Var5._M_pi = extraout_RDX;
  }
  sVar6.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar6.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqPubSub::Receive()
{
    int ret = zmq_recv(m_ZmqSocket, m_ReceiverBuffer.data(), m_ReceiverBuffer.size(), ZMQ_DONTWAIT);
    if (ret > 0)
    {
        auto buff = std::make_shared<std::vector<char>>(ret);
        std::memcpy(buff->data(), m_ReceiverBuffer.data(), ret);
        return buff;
    }
    return nullptr;
}